

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::LeastGreatestFunction<double,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  unsigned_long *puVar1;
  Vector *this;
  data_ptr_t pdVar2;
  bool bVar3;
  reference pvVar4;
  ulong uVar5;
  pointer pVVar6;
  double *pdVar7;
  VectorType vector_type_p;
  idx_t i;
  pointer pVVar8;
  idx_t col_idx;
  ulong uVar9;
  double ivalue;
  Vector *local_8a0;
  double *local_898;
  ExpressionState *local_890;
  ulong local_888;
  UnifiedVectorFormat vdata;
  bool result_has_value [2048];
  
  pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar6 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
           super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)pVVar6 - (long)pVVar8 == 0x68) {
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
    Vector::Reference(result,pvVar4);
    return;
  }
  vector_type_p = CONSTANT_VECTOR;
  local_8a0 = result;
  local_890 = state;
  for (uVar9 = 0; uVar9 < (ulong)(((long)pVVar6 - (long)pVVar8) / 0x68); uVar9 = uVar9 + 1) {
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar9);
    if (pvVar4->vector_type != CONSTANT_VECTOR) {
      vector_type_p = FLAT_VECTOR;
    }
    pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar6 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  local_898 = (double *)local_8a0->data;
  uVar9 = 0;
  switchD_016d8eb1::default(result_has_value,0,0x800);
  do {
    this = local_8a0;
    if ((ulong)(((long)pVVar6 - (long)pVVar8) / 0x68) <= uVar9) {
      StandardLeastGreatest<false>::FinalizeResult(args->count,result_has_value,local_8a0,local_890)
      ;
      Vector::SetVectorType(this,vector_type_p);
      return;
    }
    pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar9);
    if (pvVar4->vector_type == CONSTANT_VECTOR) {
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar9);
      puVar1 = (pvVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) goto LAB_01e089a2;
    }
    else {
LAB_01e089a2:
      UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar4 = vector<duckdb::Vector,_true>::get<true>(&args->data,uVar9);
      Vector::ToUnifiedFormat(pvVar4,args->count,&vdata);
      pdVar2 = vdata.data;
      local_888 = uVar9;
      if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        pdVar7 = local_898;
        for (uVar9 = 0; uVar9 < args->count; uVar9 = uVar9 + 1) {
          uVar5 = uVar9;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)(vdata.sel)->sel_vector[uVar9];
          }
          ivalue = *(double *)(pdVar2 + uVar5 * 8);
          if ((result_has_value[uVar9] != true) ||
             (bVar3 = GreaterThan::Operation<double>(pdVar7,&ivalue), bVar3)) {
            result_has_value[uVar9] = true;
            *pdVar7 = ivalue;
          }
          pdVar7 = pdVar7 + 1;
        }
      }
      else {
        pdVar7 = local_898;
        for (uVar9 = 0; uVar9 < args->count; uVar9 = uVar9 + 1) {
          uVar5 = uVar9;
          if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
            uVar5 = (ulong)(vdata.sel)->sel_vector[uVar9];
          }
          if (((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) ||
              ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6]
                >> (uVar5 & 0x3f) & 1) != 0)) &&
             ((ivalue = *(double *)(pdVar2 + uVar5 * 8), result_has_value[uVar9] != true ||
              (bVar3 = GreaterThan::Operation<double>(pdVar7,&ivalue), bVar3)))) {
            result_has_value[uVar9] = true;
            *pdVar7 = ivalue;
          }
          pdVar7 = pdVar7 + 1;
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
      uVar9 = local_888;
    }
    uVar9 = uVar9 + 1;
    pVVar8 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar6 = (args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
             super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
             super__Vector_impl_data._M_finish;
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}